

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall ThreadContext::TryRedeferral(ThreadContext *this)

{
  bool bVar1;
  uint inactiveThreshold_00;
  uint uVar2;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar3;
  BVSparse<Memory::ArenaAllocator> *this_00;
  ArenaAllocator *pAVar4;
  ScriptContext *local_68;
  ScriptContext *scriptContext;
  uint inactiveThreshold;
  TrackAllocData local_48;
  BVSparse<Memory::ArenaAllocator> *local_20;
  ActiveFunctionSet *pActiveFuncs;
  ThreadContext *pTStack_10;
  bool doRedefer;
  ThreadContext *this_local;
  
  pTStack_10 = this;
  pActiveFuncs._7_1_ = DoRedeferFunctionBodies(this);
  local_20 = (BVSparse<Memory::ArenaAllocator> *)0x0;
  if ((bool)pActiveFuncs._7_1_) {
    pAVar3 = &GetThreadAlloc(this)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&BVSparse<Memory::ArenaAllocator>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
               ,0xafd);
    pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar3,&local_48);
    this_00 = (BVSparse<Memory::ArenaAllocator> *)
              new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar3,0x3f67b0);
    pAVar4 = GetThreadAlloc(this);
    BVSparse<Memory::ArenaAllocator>::BVSparse(this_00,pAVar4);
    local_20 = this_00;
    GetActiveFunctions(this,this_00);
    this->redeferredFunctions = 0;
    this->recoveredBytes = 0;
  }
  inactiveThreshold_00 = GetRedeferralInactiveThreshold(this);
  for (local_68 = GetScriptContextList(this); local_68 != (ScriptContext *)0x0;
      local_68 = local_68->next) {
    uVar2 = (*(local_68->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
    if ((uVar2 & 1) == 0) {
      Js::ScriptContext::RedeferFunctionBodies(local_68,local_20,inactiveThreshold_00);
    }
  }
  if (local_20 != (BVSparse<Memory::ArenaAllocator> *)0x0) {
    pAVar4 = GetThreadAlloc(this);
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::ArenaAllocator>>
              (pAVar4,local_20);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ebe7c8,RedeferralPhase);
    if ((bVar1) && (this->redeferredFunctions != 0)) {
      Output::Print(L"Redeferred: %d, Bytes: 0x%x\n",(ulong)this->redeferredFunctions,
                    (ulong)this->recoveredBytes);
    }
  }
  return;
}

Assistant:

void
ThreadContext::TryRedeferral()
{
    bool doRedefer = this->DoRedeferFunctionBodies();

    // Collect the set of active functions.
    ActiveFunctionSet *pActiveFuncs = nullptr;
    if (doRedefer)
    {
        pActiveFuncs = Anew(this->GetThreadAlloc(), ActiveFunctionSet, this->GetThreadAlloc());
        this->GetActiveFunctions(pActiveFuncs);
#if DBG
        this->redeferredFunctions = 0;
        this->recoveredBytes = 0;
#endif
    }

    uint inactiveThreshold = this->GetRedeferralInactiveThreshold();
    Js::ScriptContext *scriptContext;
    for (scriptContext = GetScriptContextList(); scriptContext; scriptContext = scriptContext->next)
    {
        if (scriptContext->IsClosed())
        {
            continue;
        }
        scriptContext->RedeferFunctionBodies(pActiveFuncs, inactiveThreshold);
    }

    if (pActiveFuncs)
    {
        Adelete(this->GetThreadAlloc(), pActiveFuncs);
#if DBG
        if (PHASE_STATS1(Js::RedeferralPhase) && this->redeferredFunctions)
        {
            Output::Print(_u("Redeferred: %d, Bytes: 0x%x\n"), this->redeferredFunctions, this->recoveredBytes);
        }
#endif
    }
}